

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ShaderSourceCase::test(ShaderSourceCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  GLuint shader;
  char *description;
  TestContext *pTVar2;
  int iVar3;
  StateQueryMemoryWriteGuard<int> sourceLength_1;
  StateQueryMemoryWriteGuard<int> sourceLength;
  char buffer [2048];
  string local_9c5;
  StateQueryMemoryWriteGuard<int> local_9c4;
  undefined1 local_9b8 [16];
  TestLog local_9a8 [13];
  ios_base local_940 [264];
  undefined1 local_838 [16];
  TestLog local_828 [13];
  ios_base local_7c0 [1936];
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    this_00,shader,0x8b88,0);
  glu::CallLogWrapper::glShaderSource
            (this_00,shader,1,&(anonymous_namespace)::brokenShader,(GLint *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_9b8._0_8_ = (TestLog *)0xdededededededede;
  local_9b8._8_4_ = 0xdededede;
  glu::CallLogWrapper::glGetShaderiv(this_00,shader,0x8b88,(GLint *)(local_9b8 + 4));
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            ((StateQueryMemoryWriteGuard<int> *)local_9b8,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_838,(anonymous_namespace)::brokenShader,(allocator<char> *)&local_9c4);
  iVar3 = local_838._8_4_ + 1;
  if ((TestLog *)local_838._0_8_ != local_828) {
    operator_delete((void *)local_838._0_8_,(ulong)((long)&(local_828[0].m_log)->flags + 1));
  }
  if (local_9b8._4_4_ != iVar3) {
    local_838._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_838 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: Expected length ",0x1a);
    std::ostream::operator<<(poVar1,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"; got ",6);
    std::ostream::operator<<(poVar1,local_9b8._4_4_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_838,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_7c0);
    pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"got invalid source length");
    }
  }
  local_9b8._0_8_ = (anonymous_namespace)::brokenShader;
  local_9b8._8_8_ = (anonymous_namespace)::brokenShader;
  glu::CallLogWrapper::glShaderSource(this_00,shader,2,(GLchar **)local_9b8,(GLint *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_9c4.m_preguard = -0x21212122;
  local_9c4.m_value = -0x21212122;
  local_9c4.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetShaderiv(this_00,shader,0x8b88,&local_9c4.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            (&local_9c4,(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_838,(anonymous_namespace)::brokenShader,(allocator<char> *)&local_9c5);
  iVar3 = local_838._8_4_ * 2 + 1;
  if ((TestLog *)local_838._0_8_ != local_828) {
    operator_delete((void *)local_838._0_8_,(ulong)((long)&(local_828[0].m_log)->flags + 1));
  }
  if (local_9c4.m_value != iVar3) {
    local_838._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_838 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: Expected length ",0x1a);
    std::ostream::operator<<(poVar1,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"; got ",6);
    std::ostream::operator<<(poVar1,local_9c4.m_value);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_838,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_7c0);
    pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"got invalid source length");
    }
  }
  memset(local_838,0,0x800);
  local_838[0] = (string)0x78;
  local_9c4._0_8_ = local_9c4._0_8_ & 0xffffffff00000000;
  glu::CallLogWrapper::glGetShaderSource(this_00,shader,0x800,&local_9c4.m_preguard,local_838);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_9b8,(anonymous_namespace)::brokenShader,(allocator<char> *)&local_9c5);
  iVar3 = local_9b8._8_4_ * 2;
  if ((TestLog *)local_9b8._0_8_ != local_9a8) {
    operator_delete((void *)local_9b8._0_8_,(ulong)((long)&(local_9a8[0].m_log)->flags + 1));
  }
  if (local_9c4.m_preguard == iVar3) {
    if (local_838[iVar3] == '\0') goto LAB_00624836;
    local_9b8._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_9b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: Expected null terminator at ",0x26);
    std::ostream::operator<<(poVar1,iVar3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_9b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_940);
    pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar2->m_testResult != QP_TEST_RESULT_PASS) goto LAB_00624836;
    description = "did not get a null terminator";
  }
  else {
    local_9b8._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_9b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: Expected write length ",0x20);
    std::ostream::operator<<(poVar1,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"; got ",6);
    std::ostream::operator<<(poVar1,local_9c4.m_preguard);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_9b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_940);
    pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar2->m_testResult != QP_TEST_RESULT_PASS) goto LAB_00624836;
    description = "got invalid source length";
  }
  tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,description);
LAB_00624836:
  memset(local_838,0,0x800);
  local_838[0] = (string)0x78;
  local_9c4._0_8_ = local_9c4._0_8_ & 0xffffffff00000000;
  glu::CallLogWrapper::glGetShaderSource(this_00,shader,1,&local_9c4.m_preguard,local_838);
  if (local_9c4.m_preguard != 0) {
    local_9b8._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_9b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: Expected write length 0; got ",0x27);
    std::ostream::operator<<(poVar1,local_9c4.m_preguard);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_9b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_940);
    pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"got invalid source length");
    }
  }
  if (local_838[0] != (string)0x0) {
    local_9b8._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_9b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: Expected null terminator; got=",0x28);
    std::ostream::operator<<(poVar1,(int)(char)local_838[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", char=",7);
    local_9c5 = local_838[0];
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_9c5,1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_9b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_940);
    pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"got invalid terminator");
    }
  }
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		// SHADER_SOURCE_LENGTH does include 0-terminator
		const GLuint shader = glCreateShader(GL_VERTEX_SHADER);
		verifyShaderParam(m_testCtx, *this, shader, GL_SHADER_SOURCE_LENGTH, 0);

		// check the SHADER_SOURCE_LENGTH
		{
			glShaderSource(shader, 1, &brokenShader, DE_NULL);
			expectError(GL_NO_ERROR);

			StateQueryMemoryWriteGuard<GLint> sourceLength;
			glGetShaderiv(shader, GL_SHADER_SOURCE_LENGTH, &sourceLength);

			sourceLength.verifyValidity(m_testCtx);

			const GLint referenceLength = (GLint)std::string(brokenShader).length() + 1; // including the null terminator
			if (sourceLength != referenceLength)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected length " << referenceLength	<< "; got " << sourceLength << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid source length");
			}
		}

		// check the concat source SHADER_SOURCE_LENGTH
		{
			const char* shaders[] = {brokenShader, brokenShader};
			glShaderSource(shader, 2, shaders, DE_NULL);
			expectError(GL_NO_ERROR);

			StateQueryMemoryWriteGuard<GLint> sourceLength;
			glGetShaderiv(shader, GL_SHADER_SOURCE_LENGTH, &sourceLength);

			sourceLength.verifyValidity(m_testCtx);

			const GLint referenceLength = 2 * (GLint)std::string(brokenShader).length() + 1; // including the null terminator
			if (sourceLength != referenceLength)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected length " << referenceLength << "; got " << sourceLength << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid source length");
			}
		}

		// check the string length
		{
			char buffer[2048] = {'x'};
			DE_ASSERT(DE_LENGTH_OF_ARRAY(buffer) > 2 * (int)std::string(brokenShader).length());

			GLint written = 0; // not inluding null-terminator
			glGetShaderSource(shader, DE_LENGTH_OF_ARRAY(buffer), &written, buffer);

			const GLint referenceLength = 2 * (GLint)std::string(brokenShader).length();
			if (written != referenceLength)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected write length " << referenceLength << "; got " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid source length");
			}
			// check null pointer at
			else
			{
				if (buffer[referenceLength] != '\0')
				{
					m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected null terminator at " << referenceLength << TestLog::EndMessage;
					if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
						m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "did not get a null terminator");
				}
			}
		}

		// check with small buffer
		{
			char buffer[2048] = {'x'};

			GLint written = 0;
			glGetShaderSource(shader, 1, &written, buffer);

			if (written != 0)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected write length 0; got " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid source length");
			}
			if (buffer[0] != '\0')
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected null terminator; got=" << int(buffer[0]) << ", char=" << buffer[0] << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid terminator");
			}
		}

		glDeleteShader(shader);
		expectError(GL_NO_ERROR);
	}